

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psa_crypto.c
# Opt level: O1

psa_status_t psa_generate_key(psa_key_attributes_t *attributes,psa_key_handle_t *handle)

{
  ushort uVar1;
  ushort type;
  ulong uVar2;
  bool bVar3;
  psa_key_slot_t *ppVar4;
  uint uVar5;
  uint uVar6;
  mbedtls_ecp_group_id grp_id;
  int ret;
  mbedtls_ecp_curve_info *pmVar7;
  mbedtls_ecp_keypair *pmVar8;
  ulong uVar9;
  code *driver_00;
  psa_se_drv_table_entry_t **in_R8;
  uint exponent;
  psa_key_slot_t *slot;
  psa_se_drv_table_entry_t *driver;
  psa_key_slot_t *local_40;
  psa_key_slot_t *local_38;
  
  local_40 = (psa_key_slot_t *)0x0;
  local_38 = (psa_key_slot_t *)0x0;
  if ((attributes->core).bits == 0) {
    return -0x87;
  }
  driver_00 = (code *)handle;
  uVar5 = psa_start_key_creation
                    ((psa_key_creation_method_t)attributes,(psa_key_attributes_t *)handle,
                     (psa_key_handle_t *)&local_40,&local_38,in_R8);
  ppVar4 = local_40;
  if (uVar5 != 0) goto LAB_00112a1a;
  uVar2 = attributes->domain_parameters_size;
  uVar5 = 0xffffff79;
  if (attributes->domain_parameters == (void *)0x0 && uVar2 != 0) goto LAB_00112a1a;
  uVar1 = (attributes->core).bits;
  pmVar8 = (mbedtls_ecp_keypair *)(ulong)uVar1;
  type = (local_40->attr).type;
  exponent = (uint)type;
  if (((exponent & 0x7000) == 0x2000) || ((exponent & 0x7000) == 0x1000)) {
    uVar6 = prepare_raw_data_slot(type,(size_t)pmVar8,&(local_40->data).raw);
    if (uVar6 == 0) {
      pmVar8 = (mbedtls_ecp_keypair *)(ppVar4->data).raw.bytes;
      uVar6 = psa_generate_random((ppVar4->data).raw.data,(size_t)pmVar8);
      if (uVar6 == 0) {
        bVar3 = true;
        driver_00 = (code *)pmVar8;
        if (exponent == 0x2301) {
          driver_00 = (code *)(ppVar4->data).raw.bytes;
          psa_des_set_key_parity((ppVar4->data).raw.data,(size_t)driver_00);
        }
        goto joined_r0x00112843;
      }
    }
    bVar3 = false;
    driver_00 = (code *)pmVar8;
    uVar5 = uVar6;
  }
  else {
    if (type == 0x7001) {
      uVar5 = 0;
      if ((uVar1 & 7) == 0 && uVar1 < 0x1001) {
        if (uVar2 == 0) {
          exponent = 0x10001;
        }
        else if (uVar2 < 5) {
          exponent = 0;
          uVar9 = 0;
          do {
            uVar5 = exponent << 8;
            exponent = *(byte *)((long)attributes->domain_parameters + uVar9) | uVar5;
            uVar9 = uVar9 + 1;
          } while (uVar2 != uVar9);
          uVar5 = (int)uVar5 >> 0x1f & 0xffffff7a;
        }
        else {
          uVar5 = 0xffffff7a;
        }
        if (uVar5 == 0) {
          driver_00 = (code *)0x150;
          pmVar8 = (mbedtls_ecp_keypair *)calloc(1,0x150);
          if (pmVar8 == (mbedtls_ecp_keypair *)0x0) {
LAB_00112a06:
            uVar5 = 0xffffff73;
          }
          else {
            mbedtls_rsa_init((mbedtls_rsa_context *)pmVar8,0,0);
            driver_00 = mbedtls_ctr_drbg_random;
            ret = mbedtls_rsa_gen_key((mbedtls_rsa_context *)pmVar8,mbedtls_ctr_drbg_random,
                                      &global_data.ctr_drbg,(uint)uVar1,exponent);
            if (ret == 0) {
              (ppVar4->data).rsa = (mbedtls_rsa_context *)pmVar8;
LAB_00112a57:
              bVar3 = true;
              goto joined_r0x00112843;
            }
            mbedtls_rsa_free((mbedtls_rsa_context *)pmVar8);
LAB_001129f6:
            free(pmVar8);
            uVar5 = mbedtls_to_psa_error(ret);
          }
        }
      }
      else {
        uVar5 = 0xffffff7a;
      }
    }
    else {
      uVar5 = 0xffffff7a;
      if ((exponent & 0xff00) != 0x7100) goto LAB_00112a1a;
      driver_00 = (code *)(ulong)(uVar1 + 7 >> 3);
      grp_id = mbedtls_ecc_group_of_psa((psa_ecc_curve_t)type,(size_t)driver_00);
      pmVar7 = mbedtls_ecp_curve_info_from_grp_id(grp_id);
      uVar5 = 0xffffff7a;
      if ((uVar2 == 0) && (pmVar7 != (mbedtls_ecp_curve_info *)0x0 && grp_id != MBEDTLS_ECP_DP_NONE)
         ) {
        if (pmVar7->bit_size == uVar1) {
          driver_00 = (code *)0x158;
          pmVar8 = (mbedtls_ecp_keypair *)calloc(1,0x158);
          if (pmVar8 != (mbedtls_ecp_keypair *)0x0) {
            mbedtls_ecp_keypair_init(pmVar8);
            driver_00 = (code *)pmVar8;
            ret = mbedtls_ecp_gen_key(grp_id,pmVar8,mbedtls_ctr_drbg_random,&global_data.ctr_drbg);
            if (ret == 0) {
              (ppVar4->data).ecp = pmVar8;
              goto LAB_00112a57;
            }
            mbedtls_ecp_keypair_free(pmVar8);
            goto LAB_001129f6;
          }
          goto LAB_00112a06;
        }
        uVar5 = 0xffffff79;
      }
    }
    bVar3 = false;
  }
joined_r0x00112843:
  if (bVar3) {
    uVar5 = 0;
  }
LAB_00112a1a:
  if (uVar5 == 0) {
    uVar5 = psa_finish_key_creation(local_40,(psa_se_drv_table_entry_t *)driver_00);
  }
  if (uVar5 != 0) {
    if (local_40 != (psa_key_slot_t *)0x0) {
      psa_wipe_key_slot(local_40);
    }
    *handle = 0;
  }
  return uVar5;
}

Assistant:

psa_status_t psa_generate_key( const psa_key_attributes_t *attributes,
                               psa_key_handle_t *handle )
{
    psa_status_t status;
    psa_key_slot_t *slot = NULL;
    psa_se_drv_table_entry_t *driver = NULL;

    /* Reject any attempt to create a zero-length key so that we don't
     * risk tripping up later, e.g. on a malloc(0) that returns NULL. */
    if( psa_get_key_bits( attributes ) == 0 )
        return( PSA_ERROR_INVALID_ARGUMENT );

    status = psa_start_key_creation( PSA_KEY_CREATION_GENERATE,
                                     attributes, handle, &slot, &driver );
    if( status != PSA_SUCCESS )
        goto exit;

#if defined(MBEDTLS_PSA_CRYPTO_SE_C)
    if( driver != NULL )
    {
        const psa_drv_se_t *drv = psa_get_se_driver_methods( driver );
        size_t pubkey_length = 0; /* We don't support this feature yet */
        if( drv->key_management == NULL ||
            drv->key_management->p_generate == NULL )
        {
            status = PSA_ERROR_NOT_SUPPORTED;
            goto exit;
        }
        status = drv->key_management->p_generate(
            psa_get_se_driver_context( driver ),
            slot->data.se.slot_number, attributes,
            NULL, 0, &pubkey_length );
    }
    else
#endif /* MBEDTLS_PSA_CRYPTO_SE_C */
    {
        status = psa_generate_key_internal(
            slot, attributes->core.bits,
            attributes->domain_parameters, attributes->domain_parameters_size );
    }

exit:
    if( status == PSA_SUCCESS )
        status = psa_finish_key_creation( slot, driver );
    if( status != PSA_SUCCESS )
    {
        psa_fail_key_creation( slot, driver );
        *handle = 0;
    }
    return( status );
}